

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

BBox3fa * __thiscall
embree::avx2::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t i)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  pcVar2 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
  uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  sVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
  lVar8 = uVar1 * sVar3;
  lVar9 = (uVar1 + 1) * sVar3;
  auVar5 = vminps_avx(*(undefined1 (*) [16])(pcVar2 + lVar8),*(undefined1 (*) [16])(pcVar2 + lVar9))
  ;
  auVar4 = vmaxps_avx(*(undefined1 (*) [16])(pcVar2 + lVar8),*(undefined1 (*) [16])(pcVar2 + lVar9))
  ;
  auVar10 = vmaxss_avx(ZEXT416(*(uint *)(pcVar2 + lVar9 + 0xc)),
                       ZEXT416(*(uint *)(pcVar2 + lVar8 + 0xc)));
  fVar6 = auVar10._0_4_ * (this->super_LineSegments).maxRadiusScale;
  auVar10._4_4_ = fVar6;
  auVar10._0_4_ = fVar6;
  auVar10._8_4_ = fVar6;
  auVar10._12_4_ = fVar6;
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar5,auVar10);
  (__return_storage_ptr__->lower).field_0 = aVar7;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar4._0_4_ + fVar6;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar4._4_4_ + fVar6;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar4._8_4_ + fVar6;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar4._12_4_ + fVar6;
  return __return_storage_ptr__;
}

Assistant:

__forceinline const T& operator [](size_t i) const { assert(i<num); return *(T*)(ptr_ofs + i*stride); }